

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_insert_sibling(lyd_node *sibling,lyd_node *node,lyd_node **first)

{
  LY_ERR LVar1;
  char *pcVar2;
  lyd_node *first_sibling;
  
  if (node == (lyd_node *)0x0) {
    pcVar2 = "node";
  }
  else {
    if (sibling != node) {
      if ((sibling != (lyd_node *)0x0) &&
         (LVar1 = lyd_insert_check_schema((lysc_node *)0x0,sibling->schema,node->schema),
         LVar1 != LY_SUCCESS)) {
        return LVar1;
      }
      first_sibling = lyd_first_sibling(sibling);
      if ((node->parent == (lyd_node_inner *)0x0) &&
         ((node->prev->next == (lyd_node *)0x0 && (node->next != (lyd_node *)0x0)))) {
        LVar1 = lyd_move_nodes((lyd_node *)0x0,&first_sibling,node);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
      else {
        LVar1 = lyd_unlink_tree(node);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        lyd_insert_node((lyd_node *)0x0,&first_sibling,node,0);
      }
      if (first == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *first = first_sibling;
      return LY_SUCCESS;
    }
    pcVar2 = "sibling != node";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lyd_insert_sibling")
  ;
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_insert_sibling(struct lyd_node *sibling, struct lyd_node *node, struct lyd_node **first)
{
    struct lyd_node *first_sibling;

    LY_CHECK_ARG_RET(NULL, node, sibling != node, LY_EINVAL);

    if (sibling) {
        LY_CHECK_RET(lyd_insert_check_schema(NULL, sibling->schema, node->schema));
    }

    first_sibling = lyd_first_sibling(sibling);
    if (node->parent || node->prev->next || !node->next) {
        LY_CHECK_RET(lyd_unlink_tree(node));
        lyd_insert_node(NULL, &first_sibling, node, LYD_INSERT_NODE_DEFAULT);
    } else {
        LY_CHECK_RET(lyd_move_nodes(NULL, &first_sibling, node));
    }

    if (first) {
        *first = first_sibling;
    }

    return LY_SUCCESS;
}